

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::getFilterOnWrite(QPDFObjectHandle *this)

{
  bool bVar1;
  QPDFObjectHandle QStack_18;
  
  as_stream(&QStack_18,(typed)this);
  bVar1 = ::qpdf::Stream::getFilterOnWrite((Stream *)&QStack_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&QStack_18.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::getFilterOnWrite()
{
    return as_stream(error).getFilterOnWrite();
}